

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

void am_invoke_ok_proc(Am_Object *cmd)

{
  Am_Input_Char AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  char *s;
  ostream *poVar4;
  Am_Wrapper *value;
  Am_Slot_Key key;
  Am_Input_Char local_2d4;
  Am_Object invoke_window;
  Am_Object match_command;
  Am_Object script_execute_command;
  Am_Value before_after;
  Am_String accel_string;
  Am_Object script_window;
  Am_Object local_298;
  Am_Object local_290;
  Am_Object window;
  Am_Object sel_widget;
  Am_Object undo_db;
  ostrstream oss;
  ushort local_26e;
  char line [250];
  
  Am_Object::Get_Object((Am_Object *)&oss,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&invoke_window,(Am_Slot_Key)&oss,10);
  Am_Object::~Am_Object((Am_Object *)&oss);
  pAVar3 = Am_Object::Get(&invoke_window,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&script_window,pAVar3);
  pAVar3 = Am_Object::Get(&script_window,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&undo_db,pAVar3);
  pAVar3 = Am_Object::Get(&undo_db,0x197,0);
  Am_Object::Am_Object(&sel_widget,pAVar3);
  pAVar3 = Am_Object::Get(&sel_widget,0x68,0);
  Am_Object::Am_Object(&window,pAVar3);
  pAVar3 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&script_execute_command,pAVar3);
  Am_Object::Get_Object((Am_Object *)&oss,(Am_Slot_Key)&invoke_window,0x152);
  pAVar3 = Am_Object::Get((Am_Object *)&oss,0x169,0);
  Am_String::Am_String(&accel_string,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&oss);
  Am_Input_Char::Am_Input_Char(&local_2d4,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  Am_Object::Get_Object((Am_Object *)&oss,(Am_Slot_Key)&invoke_window,(ulong)Am_DO_ACCELERATOR);
  pAVar3 = Am_Object::Get((Am_Object *)&oss,0x169,0);
  bVar2 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object((Am_Object *)&oss);
  if (bVar2) {
    bVar2 = Am_String::operator==(&accel_string,"");
    if (bVar2) {
      std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&oss,"To attach to accelerator, need to fill in key",0x2d);
      std::ostream::put((char)&oss);
      Am_Pop_Up_Error_Window(line);
      std::ostrstream::~ostrstream(&oss);
      goto LAB_002014df;
    }
    s = Am_String::operator_cast_to_char_(&accel_string);
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)&oss,s,false);
    local_2d4._2_2_ = local_26e & 0xfff | local_2d4._2_2_ & 0xf000;
    local_2d4.code = _oss;
    AVar1 = local_2d4;
    Am_Object::Am_Object(&local_290,&window);
    Am_Check_Accelerator_Char_For_Window(SUB84(&before_after,0),(Am_Object *)(ulong)(uint)AVar1);
    Am_Object::~Am_Object(&local_290);
    bVar2 = Am_Object::Valid((Am_Object *)&before_after);
    if (bVar2) {
      bVar2 = Am_Object::operator!=((Am_Object *)&before_after,&script_execute_command);
      if (bVar2) {
        std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss,"Accelerator ",0xc);
        poVar4 = operator<<((ostream *)&oss,&local_2d4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," already in use by ",0x13);
        poVar4 = operator<<(poVar4,(Am_Object *)&before_after);
        std::ostream::put((char)poVar4);
        Am_Pop_Up_Error_Window(line);
        std::ostrstream::~ostrstream(&oss);
        Am_Object::~Am_Object((Am_Object *)&before_after);
        goto LAB_002014df;
      }
    }
    Am_Object::~Am_Object((Am_Object *)&before_after);
  }
  Am_Input_Char::operator_cast_to_Am_Value(&local_2d4);
  Am_Object::Set(&script_execute_command,0x152,(Am_Value *)&oss,0);
  Am_Value::~Am_Value((Am_Value *)&oss);
  Am_Object::Get_Object((Am_Object *)&oss,(Am_Slot_Key)&invoke_window,(ulong)Am_BEFORE_OR_AFTER);
  pAVar3 = Am_Object::Get((Am_Object *)&oss,0x169,0);
  Am_Value::Am_Value(&before_after,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&oss);
  pAVar3 = Am_Object::Get(&invoke_window,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&match_command,pAVar3);
  bVar2 = Am_Value::Valid(&before_after);
  if (bVar2) {
    bVar2 = Am_Object::Valid(&match_command);
    if (bVar2) {
      Am_Object::Set(&match_command,Am_BEFORE_OR_AFTER,&before_after,1);
      Am_Object::Get_Object
                ((Am_Object *)&oss,(Am_Slot_Key)&invoke_window,(ulong)Am_UNDO_SCROLL_GROUP);
      pAVar3 = Am_Object::Get((Am_Object *)&oss,0xa2,0);
      copy_values_to_match_command(&match_command,pAVar3);
      Am_Object::~Am_Object((Am_Object *)&oss);
      Am_Object::Set(&script_execute_command,Am_BEFORE_OR_AFTER,&before_after,0);
      key = Am_BEFORE_OR_AFTER_COMMAND;
      value = Am_Object::operator_cast_to_Am_Wrapper_(&match_command);
LAB_0020143f:
      Am_Object::Set(&script_execute_command,key,value,0);
      goto LAB_00201451;
    }
    std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss,"For before/after command, need to use \"Load\" button.",0x34);
    std::ostream::put((char)&oss);
    Am_Pop_Up_Error_Window(line);
    std::ostrstream::~ostrstream(&oss);
  }
  else {
    bVar2 = Am_Object::Valid(&match_command);
    if (bVar2) {
      am_remove_match_command(&match_command);
      Am_Object::Set(&script_execute_command,Am_BEFORE_OR_AFTER,0,0);
      key = Am_BEFORE_OR_AFTER_COMMAND;
      value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
      goto LAB_0020143f;
    }
LAB_00201451:
    Am_Object::Am_Object(&local_298,&invoke_window);
    done_with_invoke_window(&local_298);
    Am_Object::~Am_Object(&local_298);
  }
  Am_Object::~Am_Object(&match_command);
  Am_Value::~Am_Value(&before_after);
LAB_002014df:
  Am_String::~Am_String(&accel_string);
  Am_Object::~Am_Object(&script_execute_command);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&sel_widget);
  Am_Object::~Am_Object(&undo_db);
  Am_Object::~Am_Object(&script_window);
  Am_Object::~Am_Object(&invoke_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_invoke_ok, (Am_Object cmd))
{
  Am_Object invoke_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_window = invoke_window.Get(Am_SCRIPT_WINDOW);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
  Am_Object window = sel_widget.Get(Am_WINDOW);
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);

  // deal with accelerator char
  Am_String accel_string =
      invoke_window.Get_Object(Am_ACCELERATOR).Get(Am_VALUE);
  Am_Input_Char accel_char;
  if (invoke_window.Get_Object(Am_DO_ACCELERATOR).Get(Am_VALUE).Valid()) {
    if (accel_string != "") {
      accel_char = Am_Input_Char(accel_string, false);
      // check if this accelerator already in use
      Am_Object other_cmd =
          Am_Check_Accelerator_Char_For_Window(accel_char, window);
      if (other_cmd.Valid() && other_cmd != script_execute_command) {
        AM_POP_UP_ERROR_WINDOW(
            "Accelerator " << accel_char << " already in use by " << other_cmd);
        return; //don't make the window invisible if invalid
      }
    } else {
      AM_POP_UP_ERROR_WINDOW("To attach to accelerator, need to fill in key");
      return; //don't make the window invisible if invalid
    }
  }
  script_execute_command.Set(Am_ACCELERATOR, accel_char);

  // deal with before/after commands
  Am_Value before_after =
      invoke_window.Get_Object(Am_BEFORE_OR_AFTER).Get(Am_VALUE);
  Am_Object match_command = invoke_window.Get(Am_INVOKE_MATCH_COMMAND);
  if (before_after.Valid()) {
    if (!match_command.Valid()) {
      AM_POP_UP_ERROR_WINDOW(
          "For before/after command, need to use \"Load\" button.");
      return; //don't make the window invisible if invalid
    }
    match_command.Set(Am_BEFORE_OR_AFTER, before_after, Am_OK_IF_NOT_THERE);
    copy_values_to_match_command(
        match_command,
        invoke_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_ITEMS));
    script_execute_command.Set(Am_BEFORE_OR_AFTER, before_after);
    script_execute_command.Set(Am_BEFORE_OR_AFTER_COMMAND, match_command);
  } else if (match_command.Valid()) {
    am_remove_match_command(match_command);
    script_execute_command.Set(Am_BEFORE_OR_AFTER, 0);
    script_execute_command.Set(Am_BEFORE_OR_AFTER_COMMAND, Am_No_Object);
  }
  done_with_invoke_window(invoke_window);
}